

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_test.cc
# Opt level: O3

void __thiscall
EVPTest_WycheproofRSAOAEP4096_Test::TestBody(EVPTest_WycheproofRSAOAEP4096_Test *this)

{
  RunWycheproofOAEPTest("third_party/wycheproof_testvectors/rsa_oaep_4096_sha256_mgf1sha1_test.txt")
  ;
  RunWycheproofOAEPTest
            ("third_party/wycheproof_testvectors/rsa_oaep_4096_sha256_mgf1sha256_test.txt");
  RunWycheproofOAEPTest("third_party/wycheproof_testvectors/rsa_oaep_4096_sha512_mgf1sha1_test.txt")
  ;
  RunWycheproofOAEPTest
            ("third_party/wycheproof_testvectors/rsa_oaep_4096_sha512_mgf1sha512_test.txt");
  return;
}

Assistant:

TEST(EVPTest, WycheproofRSAOAEP4096) {
  RunWycheproofOAEPTest(
      "third_party/wycheproof_testvectors/"
      "rsa_oaep_4096_sha256_mgf1sha1_test.txt");
  RunWycheproofOAEPTest(
      "third_party/wycheproof_testvectors/"
      "rsa_oaep_4096_sha256_mgf1sha256_test.txt");
  RunWycheproofOAEPTest(
      "third_party/wycheproof_testvectors/"
      "rsa_oaep_4096_sha512_mgf1sha1_test.txt");
  RunWycheproofOAEPTest(
      "third_party/wycheproof_testvectors/"
      "rsa_oaep_4096_sha512_mgf1sha512_test.txt");
}